

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int MakeGetMessageEx(char *url_str,membuffer *request,uri_type *url,SendInstruction *pRangeSpecifier
                    )

{
  char *local_60;
  char *hoststr;
  size_t hostlen;
  size_t sStack_48;
  int ret_code;
  size_t url_str_len;
  SendInstruction *pRangeSpecifier_local;
  uri_type *url_local;
  membuffer *request_local;
  char *url_str_local;
  
  hostlen._4_4_ = 0;
  hoststr = (char *)0x0;
  url_str_len = (size_t)pRangeSpecifier;
  pRangeSpecifier_local = (SendInstruction *)url;
  url_local = (uri_type *)request;
  request_local = (membuffer *)url_str;
  sStack_48 = strlen(url_str);
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x817,"DOWNLOAD URL : %s\n",
             request_local);
  hostlen._4_4_ = http_FixStrUrl((char *)request_local,sStack_48,(uri_type *)pRangeSpecifier_local);
  if (hostlen._4_4_ == 0) {
    membuffer_init((membuffer *)url_local);
    hostlen._4_4_ = get_hoststr((char *)request_local,&local_60,(size_t *)&hoststr);
    if (hostlen._4_4_ == 0) {
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x827,
                 "HOSTNAME : %s Length : %zu\n",local_60,hoststr);
      hostlen._4_4_ =
           http_MakeMessage((membuffer *)url_local,1,1,"QsbcGDCUc",2,
                            *(undefined8 *)(pRangeSpecifier_local->RangeHeader + 0x10),
                            *(undefined8 *)(pRangeSpecifier_local->RangeHeader + 0x18),"HOST: ",
                            local_60,hoststr,url_str_len);
      if (hostlen._4_4_ != 0) {
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x83d,
                   "HTTP Makemessage failed\n");
        membuffer_destroy((membuffer *)url_local);
        return hostlen._4_4_;
      }
    }
  }
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x846,
             "HTTP Buffer:\n%s\n----------END--------\n",*(undefined8 *)url_local);
  return hostlen._4_4_;
}

Assistant:

int MakeGetMessageEx(const char *url_str,
	membuffer *request,
	uri_type *url,
	struct SendInstruction *pRangeSpecifier)
{
	size_t url_str_len;
	int ret_code = UPNP_E_SUCCESS;
	size_t hostlen = 0;
	const char *hoststr;

	url_str_len = strlen(url_str);
	do {
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"DOWNLOAD URL : %s\n",
			url_str);
		ret_code = http_FixStrUrl(url_str, url_str_len, url);
		if (ret_code != UPNP_E_SUCCESS) {
			break;
		}
		/* make msg */
		membuffer_init(request);
		ret_code = get_hoststr(url_str, &hoststr, &hostlen);
		if (ret_code != UPNP_E_SUCCESS) {
			break;
		}
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"HOSTNAME : %s Length : %" PRIzu "\n",
			hoststr,
			hostlen);
		ret_code = http_MakeMessage(request,
			1,
			1,
			"Q"
			"s"
			"bc"
			"GDCUc",
			HTTPMETHOD_GET,
			url->pathquery.buff,
			url->pathquery.size,
			"HOST: ",
			hoststr,
			hostlen,
			pRangeSpecifier);
		if (ret_code != 0) {
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"HTTP Makemessage failed\n");
			membuffer_destroy(request);
			return ret_code;
		}
	} while (0);
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HTTP Buffer:\n%s\n"
		"----------END--------\n",
		request->buf);

	return ret_code;
}